

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_int>::setAabb
          (btAxisSweep3Internal<unsigned_int> *this,btBroadphaseProxy *proxy,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  btDispatcher *unaff_retaddr;
  Handle *handle;
  
  *(undefined8 *)(in_RSI + 0x1c) = *in_RDX;
  *(undefined8 *)(in_RSI + 0x24) = in_RDX[1];
  *(undefined8 *)(in_RSI + 0x2c) = *in_RCX;
  *(undefined8 *)(in_RSI + 0x34) = in_RCX[1];
  updateHandle((btAxisSweep3Internal<unsigned_int> *)aabbMin,aabbMax._4_4_,(btVector3 *)dispatcher,
               (btVector3 *)handle,unaff_retaddr);
  if (*(long *)(in_RDI + 0xa0) != 0) {
    (**(code **)(**(long **)(in_RDI + 0xa0) + 0x20))
              (*(long **)(in_RDI + 0xa0),*(undefined8 *)(in_RSI + 0x58),in_RDX,in_RCX,in_R8);
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::setAabb(btBroadphaseProxy* proxy,const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
	Handle* handle = static_cast<Handle*>(proxy);
	handle->m_aabbMin = aabbMin;
	handle->m_aabbMax = aabbMax;
	updateHandle(static_cast<BP_FP_INT_TYPE>(handle->m_uniqueId), aabbMin, aabbMax,dispatcher);
	if (m_raycastAccelerator)
		m_raycastAccelerator->setAabb(handle->m_dbvtProxy,aabbMin,aabbMax,dispatcher);

}